

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O3

XrResult GenValidUsageNextXrGetSceneComputeStateMSFT
                   (XrSceneObserverMSFT sceneObserver,XrSceneComputeStateMSFT *state)

{
  XrResult XVar1;
  pair<GenValidUsageXrHandleInfo_*,_GenValidUsageXrInstanceInfo_*> pVar2;
  
  pVar2 = HandleInfo<XrSceneObserverMSFT_T_*>::getWithInstanceInfo
                    (&g_sceneobservermsft_info,sceneObserver);
  XVar1 = (*(pVar2.second)->dispatch_table->GetSceneComputeStateMSFT)(sceneObserver,state);
  return XVar1;
}

Assistant:

XRAPI_ATTR XrResult XRAPI_CALL GenValidUsageNextXrGetSceneComputeStateMSFT(
    XrSceneObserverMSFT sceneObserver,
    XrSceneComputeStateMSFT* state) {
    XrResult result = XR_SUCCESS;
    try {
        auto info_with_instance = g_sceneobservermsft_info.getWithInstanceInfo(sceneObserver);
        GenValidUsageXrHandleInfo *gen_sceneobservermsft_info = info_with_instance.first;
        (void)gen_sceneobservermsft_info;  // quiet warnings
        GenValidUsageXrInstanceInfo *gen_instance_info = info_with_instance.second;
        result = gen_instance_info->dispatch_table->GetSceneComputeStateMSFT(sceneObserver, state);
    } catch (...) {
        result = XR_ERROR_VALIDATION_FAILURE;
    }
    return result;
}